

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O0

void cppurses::detail::Screen::paint_empty_tiles(Widget *widg)

{
  bool bVar1;
  Const_reference CVar2;
  ulong uVar3;
  Point PVar4;
  Area AVar5;
  size_t local_f0;
  size_t x;
  size_t y;
  size_t x_end;
  size_t y_end;
  size_t x_begin;
  size_t y_begin;
  undefined1 local_70 [8];
  Screen_mask empty_space;
  Glyph wallpaper;
  Widget *widg_local;
  
  bVar1 = anon_unknown.dwarf_1a9dcc::has_children(widg);
  if (bVar1) {
    Widget::generate_wallpaper
              ((Glyph *)&empty_space.bits_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage,widg);
    find_empty_space((Screen_mask *)local_70,widg);
    PVar4 = Screen_mask::offset((Screen_mask *)local_70);
    x = PVar4.y;
    PVar4 = Screen_mask::offset((Screen_mask *)local_70);
    AVar5 = Screen_mask::area((Screen_mask *)local_70);
    uVar3 = x + AVar5.height;
    AVar5 = Screen_mask::area((Screen_mask *)local_70);
    for (; local_f0 = PVar4.x, x < uVar3; x = x + 1) {
      for (; local_f0 < PVar4.x + AVar5.width; local_f0 = local_f0 + 1) {
        CVar2 = Screen_mask::at((Screen_mask *)local_70,local_f0,x);
        if (CVar2) {
          output::put(local_f0,x,
                      (Glyph *)&empty_space.bits_.super__Bvector_base<std::allocator<bool>_>._M_impl
                                .super__Bvector_impl_data._M_end_of_storage);
        }
      }
    }
    Screen_mask::~Screen_mask((Screen_mask *)local_70);
    Glyph::~Glyph((Glyph *)&empty_space.bits_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void Screen::paint_empty_tiles(const Widget& widg)
{
    if (!has_children(widg)) {
        return;
    }
    const auto wallpaper   = widg.generate_wallpaper();
    const auto empty_space = find_empty_space(widg);
    const auto y_begin     = empty_space.offset().y;
    const auto x_begin     = empty_space.offset().x;
    const auto y_end       = y_begin + empty_space.area().height;
    const auto x_end       = x_begin + empty_space.area().width;
    for (auto y = y_begin; y < y_end; ++y) {
        for (auto x = x_begin; x < x_end; ++x) {
            if (empty_space.at(x, y)) {
                output::put(x, y, wallpaper);
            }
        }
    }
}